

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
::DecreaseStepWhileErrorTooBig
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
           *this,double x0,double f0,double *dx0)

{
  int iVar1;
  double *in_RSI;
  long *in_RDI;
  bool bVar2;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  double f1;
  
  while( true ) {
    dVar3 = (double)(**(code **)(*in_RDI + 0x48))(in_XMM0_Qa + *in_RSI);
    bVar2 = false;
    if ((dVar3 != in_XMM1_Qa) || (NAN(dVar3) || NAN(in_XMM1_Qa))) {
      iVar1 = (**(code **)(*in_RDI + 0xd8))(in_XMM0_Qa,in_XMM1_Qa,in_XMM0_Qa + *in_RSI,dVar3);
      bVar2 = 0 < iVar1;
    }
    if (!bVar2) break;
    *in_RSI = *in_RSI * 0.9090909090909091;
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::DecreaseStepWhileErrorTooBig(
    double x0, double f0, double& dx0) {
  double f1;
  while ( (f1=eval(x0+dx0))!=f0 &&          // same value
          0 < CompareError(x0, f0, x0+dx0, f1) ) {
    dx0 *= (1.0 / 1.1);
  }
}